

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::updatePrePartialsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *operations,int count)

{
  int iVar1;
  
  if (this->kThreadingEnabled != false) {
    return -1;
  }
  iVar1 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x35])(this,1,operations,count,0xffffffff);
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updatePrePartialsByPartition(const int* operations,
                                                                    int count) {

    int returnCode = BEAGLE_ERROR_GENERAL;

    if (kThreadingEnabled) {
//        TODO
//        returnCode = upPrePartialsByPartitionAsync(operations,
//                                                   count);
    } else {
        bool byPartition = true;
        returnCode = upPrePartials(byPartition,
                                  operations,
                                  count,
                                  BEAGLE_OP_NONE);
    }

    return returnCode;
}